

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::Call(SQVM *this,SQObjectPtr *closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr *outres
          ,SQBool raiseerror)

{
  SQObjectType SVar1;
  bool bVar2;
  SQChar *pSVar3;
  bool dummy;
  SQObjectValue local_48;
  SQObjectPtr temp;
  
  SVar1 = (closure->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    _dummy = OT_NULL;
    local_48.pTable = (SQTable *)0x0;
    temp.super_SQObject._type = OT_NULL;
    temp.super_SQObject._unVal.pTable = (SQTable *)0x0;
    CreateClassInstance(this,(closure->super_SQObject)._unVal.pClass,outres,(SQObjectPtr *)&dummy);
    if ((_dummy == OT_NATIVECLOSURE) || (bVar2 = true, _dummy == OT_CLOSURE)) {
      SQObjectPtr::operator=((this->_stack)._vals + stackbase,outres);
      bVar2 = Call(this,(SQObjectPtr *)&dummy,nparams,stackbase,&temp,raiseerror);
    }
    SQObjectPtr::~SQObjectPtr(&temp);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&dummy);
  }
  else if (SVar1 == OT_NATIVECLOSURE) {
    bVar2 = CallNative(this,(closure->super_SQObject)._unVal.pNativeClosure,nparams,stackbase,outres
                       ,-1,&dummy,&dummy);
  }
  else if (SVar1 == OT_CLOSURE) {
    bVar2 = Execute(this,closure,nparams,stackbase,outres,raiseerror,ET_CALL);
  }
  else {
    pSVar3 = GetTypeName(closure);
    bVar2 = false;
    Raise_Error(this,"attempt to call \'%s\'",pSVar3);
  }
  return bVar2;
}

Assistant:

bool SQVM::Call(SQObjectPtr &closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr &outres,SQBool raiseerror)
{
#ifdef _DEBUG
SQInteger prevstackbase = _stackbase;
#endif
    switch(sq_type(closure)) {
    case OT_CLOSURE:
        return Execute(closure, nparams, stackbase, outres, raiseerror);
        break;
    case OT_NATIVECLOSURE:{
        bool dummy;
        return CallNative(_nativeclosure(closure), nparams, stackbase, outres, -1, dummy, dummy);

                          }
        break;
    case OT_CLASS: {
        SQObjectPtr constr;
        SQObjectPtr temp;
        CreateClassInstance(_class(closure),outres,constr);
        SQObjectType ctype = sq_type(constr);
        if (ctype == OT_NATIVECLOSURE || ctype == OT_CLOSURE) {
            _stack[stackbase] = outres;
            return Call(constr,nparams,stackbase,temp,raiseerror);
        }
        return true;
                   }
        break;
    default:
        Raise_Error(_SC("attempt to call '%s'"), GetTypeName(closure));
        return false;
    }
#ifdef _DEBUG
    if(!_suspended) {
        assert(_stackbase == prevstackbase);
    }
#endif
    return true;
}